

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QLoggingRule>::reallocate
          (QMovableArrayOps<QLoggingRule> *this,qsizetype alloc,AllocationOption option)

{
  pair<QTypedArrayData<QLoggingRule>_*,_QLoggingRule_*> pVar1;
  
  pVar1 = QTypedArrayData<QLoggingRule>::reallocateUnaligned
                    ((this->super_QGenericArrayOps<QLoggingRule>).
                     super_QArrayDataPointer<QLoggingRule>.d,
                     (this->super_QGenericArrayOps<QLoggingRule>).
                     super_QArrayDataPointer<QLoggingRule>.ptr,alloc,option);
  if (pVar1.second != (QLoggingRule *)0x0) {
    (this->super_QGenericArrayOps<QLoggingRule>).super_QArrayDataPointer<QLoggingRule>.d =
         pVar1.first;
    (this->super_QGenericArrayOps<QLoggingRule>).super_QArrayDataPointer<QLoggingRule>.ptr =
         pVar1.second;
    return;
  }
  qBadAlloc();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }